

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

boxptr find_biggest_volume(boxptr boxlist,int numboxes)

{
  boxptr local_38;
  boxptr which;
  INT32 maxv;
  boxptr pbStack_20;
  int i;
  boxptr boxp;
  int numboxes_local;
  boxptr boxlist_local;
  
  which = (boxptr)0x0;
  local_38 = (boxptr)0x0;
  pbStack_20 = boxlist;
  for (maxv._4_4_ = 0; maxv._4_4_ < numboxes; maxv._4_4_ = maxv._4_4_ + 1) {
    if ((long)which < pbStack_20->volume) {
      local_38 = pbStack_20;
      which = (boxptr)pbStack_20->volume;
    }
    pbStack_20 = pbStack_20 + 1;
  }
  return local_38;
}

Assistant:

LOCAL(boxptr)
find_biggest_volume (boxptr boxlist, int numboxes)
/* Find the splittable box with the largest (scaled) volume */
/* Returns NULL if no splittable boxes remain */
{
  register boxptr boxp;
  register int i;
  register INT32 maxv = 0;
  boxptr which = NULL;
  
  for (i = 0, boxp = boxlist; i < numboxes; i++, boxp++) {
    if (boxp->volume > maxv) {
      which = boxp;
      maxv = boxp->volume;
    }
  }
  return which;
}